

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

bool can_bash(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  
  bVar1 = is_npc(ch);
  if ((((((!bVar1) || ((ch->off_flags[0] & 4) != 0)) && (6 < victim->position)) &&
       ((ch->size + -1 <= (int)victim->size && (int)victim->size <= ch->size + 1 &&
        (bVar1 = is_affected(victim,(int)gsn_protective_shield), !bVar1)))) &&
      ((bVar1 = is_affected(victim,(int)gsn_sanguine_ward), !bVar1 &&
       ((bVar1 = is_affected(victim,(int)gsn_heatshield), !bVar1 &&
        (bVar1 = is_affected(victim,(int)gsn_elecshield), !bVar1)))))) &&
     ((bVar1 = is_affected(victim,(int)gsn_airshield), !bVar1 &&
      ((bVar1 = is_affected(victim,(int)gsn_earthshield), !bVar1 &&
       (bVar1 = is_affected(victim,(int)gsn_watershield), !bVar1)))))) {
    bVar1 = is_affected(victim,(int)gsn_coldshield);
    return !bVar1;
  }
  return false;
}

Assistant:

bool can_bash(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if ((is_npc(ch) && !IS_SET(ch->off_flags, OFF_BASH))
		|| victim->position < POS_FIGHTING
		|| ch->size + 1 < victim->size
		|| ch->size - 1 > victim->size
		|| is_affected(victim, gsn_protective_shield)
		|| is_affected(victim, gsn_sanguine_ward)
		|| is_affected(victim, gsn_heatshield)
		|| is_affected(victim, gsn_elecshield)
		|| is_affected(victim, gsn_airshield)
		|| is_affected(victim, gsn_earthshield)
		|| is_affected(victim, gsn_watershield)
		|| is_affected(victim, gsn_coldshield))
	{
		return false;
	}

	return true;
}